

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O0

void update_sound(void)

{
  double local_18;
  double totfreq;
  uint totvol;
  uint c;
  
  totfreq._4_2_ = 0;
  local_18 = 0.0;
  for (totfreq._6_2_ = 1; totfreq._6_2_ < 4; totfreq._6_2_ = totfreq._6_2_ + 1) {
    totfreq._4_2_ = totfreq._4_2_ + vol[totfreq._6_2_];
    if (freqbits[totfreq._6_2_] != 0) {
      local_18 = (double)vol[totfreq._6_2_] * (4000000.0 / ((double)freqbits[totfreq._6_2_] * 32.0))
                 + local_18;
    }
  }
  if (totfreq._4_2_ == 0) {
    nosound();
  }
  else {
    sound(local_18 / (double)totfreq._4_2_);
  }
  return;
}

Assistant:

void update_sound(void) {

    uint c, totvol = 0;
    double totfreq = 0;

    for (c = 1; c < 4; c++) {    // step through each channel
        totvol += vol[c];     // keep a running volume count
        if (freqbits[c] == 0) continue;   // check to avoid divide by zero

        totfreq += vol[c] * (4000000. / (32. * freqbits[c]));
    }

    if (totvol == 0) {        // if no channels are turned on, switch off
        nosound();        // all sound
        return;
    }

    totfreq /= totvol;       // normalise sound
    sound(totfreq);        // and generate it
}